

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O0

bool StringFormatter<unsigned_long_&,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
     output_null<unsigned_long>(ostream *os,unsigned_long value)

{
  unsigned_long value_local;
  ostream *os_local;
  
  return false;
}

Assistant:

static bool output_null(std::ostream& os, T value)
    {
        if constexpr (std::is_pointer_v<T> || std::is_null_pointer_v<T>) {
            if (value)
                return false;
            os << "(null)";
            return true;
        }
        return false;
    }